

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void start_pass_prep(j_compress_ptr cinfo,J_BUF_MODE pass_mode)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  my_prep_ptr prep;
  
  lVar1 = in_RDI[0x40];
  if (in_ESI != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 3;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined4 *)(lVar1 + 0x60) = *(undefined4 *)((long)in_RDI + 0x34);
  *(undefined4 *)(lVar1 + 100) = 0;
  *(undefined4 *)(lVar1 + 0x68) = 0;
  *(int *)(lVar1 + 0x6c) = (int)in_RDI[0x2c] << 1;
  return;
}

Assistant:

METHODDEF(void)
start_pass_prep (j_compress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;

  if (pass_mode != JBUF_PASS_THRU)
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Initialize total-height counter for detecting bottom of image */
  prep->rows_to_go = cinfo->image_height;
  /* Mark the conversion buffer empty */
  prep->next_buf_row = 0;
#ifdef CONTEXT_ROWS_SUPPORTED
  /* Preset additional state variables for context mode.
   * These aren't used in non-context mode, so we needn't test which mode.
   */
  prep->this_row_group = 0;
  /* Set next_buf_stop to stop after two row groups have been read in. */
  prep->next_buf_stop = 2 * cinfo->max_v_samp_factor;
#endif
}